

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O1

void dump_features(ang_file *fff)

{
  byte bVar1;
  uint uVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  
  lVar5 = 0;
  do {
    if ((f_info[lVar5].name != (char *)0x0) && (f_info[lVar5].mimic == (feature *)0x0)) {
      file_putf(fff,"# Terrain: %s\n");
      lVar7 = 0;
      lVar4 = 0;
      do {
        bVar1 = *(byte *)(*(long *)((long)feat_x_attr + lVar7) + lVar5);
        uVar2 = *(uint *)(*(long *)((long)feat_x_char + lVar7) + lVar5 * 4);
        pcVar6 = "los";
        if (lVar4 != 0) {
          if (lVar4 == 3) {
            pcVar6 = "dark";
          }
          else if (lVar4 == 2) {
            pcVar6 = "lit";
          }
          else {
            pcVar6 = "";
            if (lVar7 == 8) {
              pcVar6 = "torch";
            }
          }
        }
        if (*pcVar6 == '\0') {
          __assert_fail("light[0]",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-prefs.c"
                        ,0x10c,"void dump_features(ang_file *)");
        }
        pcVar3 = get_feat_code_name((wchar_t)lVar5);
        file_putf(fff,"feat:%s:%s:%d:%d\n",pcVar3,pcVar6,(ulong)bVar1,(ulong)uVar2);
        lVar4 = lVar4 + 1;
        lVar7 = lVar7 + 8;
      } while (lVar7 != 0x20);
    }
    lVar5 = lVar5 + 1;
    if (lVar5 == 0x19) {
      return;
    }
  } while( true );
}

Assistant:

void dump_features(ang_file *fff)
{
	int i;

	for (i = 0; i < FEAT_MAX; i++) {
		struct feature *feat = &f_info[i];
		size_t j;

		/* Skip non-entries */
		if (!feat->name) continue;

		/* Skip mimic entries  */
		if (feat->mimic) continue;

		file_putf(fff, "# Terrain: %s\n", feat->name);
		for (j = 0; j < LIGHTING_MAX; j++) {
			uint8_t attr = feat_x_attr[j][i];
			wint_t chr = feat_x_char[j][i];

			const char *light = "";
			if (j == LIGHTING_TORCH)
				light = "torch";
			if (j == LIGHTING_LOS)
				light = "los";
			else if (j == LIGHTING_LIT)
				light = "lit";
			else if (j == LIGHTING_DARK)
				light = "dark";

			assert(light[0]);

			file_putf(fff, "feat:%s:%s:%d:%d\n",
				get_feat_code_name(i), light, attr, chr);
		}
	}
}